

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  exception *e;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_218;
  undefined1 local_1e8 [8];
  impbot bot;
  char **argv_local;
  int argc_local;
  
  bot.irc.write_handler._M_invoker = (_Invoker_type)argv;
  impbot::impbot((impbot *)local_1e8);
  e = (exception *)local_1e8;
  std::function<void(std::__cxx11::string_const&)>::function<main::__0,void>
            ((function<void(std::__cxx11::string_const&)> *)&local_218,(anon_class_8_1_ba1d3927 *)&e
            );
  impbot::add_read_handler((impbot *)local_1e8,&local_218);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_218);
  impbot::loop((impbot *)local_1e8);
  impbot::~impbot((impbot *)local_1e8);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    try {
        impbot bot;

        bot.add_read_handler([&bot](const std::string &m){
                istringstream iss(m);
                string from, type, to, body;
                iss >> from >> type >> to >> body;
                if (boost::starts_with(body, ":!time")) {
                    auto now = chrono::system_clock::to_time_t(chrono::system_clock::now());
                    bot.message(to, ctime(&now));
                }
            });

        bot.loop();
    } catch (exception &e) {
        cerr << e.what() << endl;
    }

    return 0;
}